

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  uint uVar14;
  GridSOA *pGVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  GridSOA *pGVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long lVar27;
  long lVar28;
  NodeRef *pNVar29;
  ulong uVar30;
  ulong uVar31;
  GridSOA *pGVar32;
  GridSOA *pGVar33;
  uint uVar34;
  int iVar35;
  ulong uVar36;
  size_t sVar37;
  ulong uVar38;
  undefined4 uVar39;
  ulong unaff_RBP;
  size_t mask;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  float fVar45;
  float fVar61;
  float fVar62;
  undefined1 auVar46 [16];
  float fVar63;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  float fVar83;
  float fVar84;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar85;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar87;
  float fVar94;
  float fVar96;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  float fVar100;
  uint uVar101;
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  float fVar108;
  float fVar110;
  float fVar111;
  undefined1 auVar104 [16];
  uint uVar109;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar112;
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  float fVar123;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar156;
  float fVar157;
  float fVar160;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  NodeRef *local_b48;
  ulong local_b18;
  undefined8 local_af8;
  undefined8 local_a68;
  undefined4 uStack_9ec;
  undefined1 local_9e8 [16];
  Precalculations *local_9d0;
  undefined4 local_9c4;
  GridSOA *local_9c0;
  ulong local_9b8;
  ulong local_9b0;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  ulong local_998;
  undefined1 (*local_990) [12];
  RTCFilterFunctionNArguments args;
  float local_908 [4];
  float local_8f8 [4];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  NodeRef *local_878;
  ulong local_870;
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  undefined1 local_828 [16];
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar122 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar129 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar130 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar156 = fVar122 * 0.99999964;
  fVar161 = fVar129 * 0.99999964;
  fVar141 = fVar130 * 0.99999964;
  fVar122 = fVar122 * 1.0000004;
  fVar129 = fVar129 * 1.0000004;
  fVar130 = fVar130 * 1.0000004;
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_870 = uVar42;
  iVar8 = (tray->tnear).field_0.i[k];
  iVar9 = (tray->tfar).field_0.i[k];
  local_990 = (undefined1 (*) [12])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar29 = stack + 1;
  local_9d0 = pre;
  do {
    local_878 = pNVar29;
    if (local_878 == stack) break;
    local_b48 = local_878 + -1;
    uVar31 = local_878[-1].ptr;
    do {
      if ((uVar31 & 8) == 0) {
        pfVar4 = (float *)(uVar31 + 0x20 + local_870);
        auVar69._0_4_ = (*pfVar4 - fVar5) * fVar156;
        auVar69._4_4_ = (pfVar4[1] - fVar5) * fVar156;
        auVar69._8_4_ = (pfVar4[2] - fVar5) * fVar156;
        auVar69._12_4_ = (pfVar4[3] - fVar5) * fVar156;
        pfVar4 = (float *)(uVar31 + 0x20 + uVar38);
        auVar65._0_4_ = (*pfVar4 - fVar6) * fVar161;
        auVar65._4_4_ = (pfVar4[1] - fVar6) * fVar161;
        auVar65._8_4_ = (pfVar4[2] - fVar6) * fVar161;
        auVar65._12_4_ = (pfVar4[3] - fVar6) * fVar161;
        auVar46 = maxps(auVar69,auVar65);
        pfVar4 = (float *)(uVar31 + 0x20 + uVar43);
        auVar66._0_4_ = (*pfVar4 - fVar7) * fVar141;
        auVar66._4_4_ = (pfVar4[1] - fVar7) * fVar141;
        auVar66._8_4_ = (pfVar4[2] - fVar7) * fVar141;
        auVar66._12_4_ = (pfVar4[3] - fVar7) * fVar141;
        auVar67._4_4_ = iVar8;
        auVar67._0_4_ = iVar8;
        auVar67._8_4_ = iVar8;
        auVar67._12_4_ = iVar8;
        auVar67 = maxps(auVar66,auVar67);
        auVar67 = maxps(auVar46,auVar67);
        pfVar4 = (float *)(uVar31 + 0x20 + (uVar42 ^ 0x10));
        auVar68._0_4_ = (*pfVar4 - fVar5) * fVar122;
        auVar68._4_4_ = (pfVar4[1] - fVar5) * fVar122;
        auVar68._8_4_ = (pfVar4[2] - fVar5) * fVar122;
        auVar68._12_4_ = (pfVar4[3] - fVar5) * fVar122;
        pfVar4 = (float *)(uVar31 + 0x20 + (uVar38 ^ 0x10));
        auVar88._0_4_ = (*pfVar4 - fVar6) * fVar129;
        auVar88._4_4_ = (pfVar4[1] - fVar6) * fVar129;
        auVar88._8_4_ = (pfVar4[2] - fVar6) * fVar129;
        auVar88._12_4_ = (pfVar4[3] - fVar6) * fVar129;
        auVar69 = minps(auVar68,auVar88);
        pfVar4 = (float *)(uVar31 + 0x20 + (uVar43 ^ 0x10));
        auVar89._0_4_ = (*pfVar4 - fVar7) * fVar130;
        auVar89._4_4_ = (pfVar4[1] - fVar7) * fVar130;
        auVar89._8_4_ = (pfVar4[2] - fVar7) * fVar130;
        auVar89._12_4_ = (pfVar4[3] - fVar7) * fVar130;
        auVar46._4_4_ = iVar9;
        auVar46._0_4_ = iVar9;
        auVar46._8_4_ = iVar9;
        auVar46._12_4_ = iVar9;
        auVar46 = minps(auVar89,auVar46);
        auVar46 = minps(auVar69,auVar46);
        auVar75._4_4_ = -(uint)(auVar67._4_4_ <= auVar46._4_4_);
        auVar75._0_4_ = -(uint)(auVar67._0_4_ <= auVar46._0_4_);
        auVar75._8_4_ = -(uint)(auVar67._8_4_ <= auVar46._8_4_);
        auVar75._12_4_ = -(uint)(auVar67._12_4_ <= auVar46._12_4_);
        uVar39 = movmskps((int)unaff_RBP,auVar75);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar39);
      }
      if ((uVar31 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar34 = 4;
        }
        else {
          uVar30 = uVar31 & 0xfffffffffffffff0;
          lVar40 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
            }
          }
          uVar34 = 0;
          uVar31 = *(ulong *)(uVar30 + lVar40 * 8);
          uVar41 = unaff_RBP - 1 & unaff_RBP;
          if (uVar41 != 0) {
            local_b48->ptr = uVar31;
            lVar40 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
            uVar36 = uVar41 - 1;
            while( true ) {
              local_b48 = local_b48 + 1;
              uVar31 = *(ulong *)(uVar30 + lVar40 * 8);
              uVar36 = uVar36 & uVar41;
              if (uVar36 == 0) break;
              local_b48->ptr = uVar31;
              lVar40 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
              uVar41 = uVar36 - 1;
            }
          }
        }
      }
      else {
        uVar34 = 6;
      }
    } while (uVar34 == 0);
    if (uVar34 == 6) {
      if (((uint)uVar31 & 0xf) == 8) {
        pGVar15 = (local_9d0->super_Precalculations).grid;
        uVar30 = (ulong)*(uint *)(pGVar15 + 0xc);
        lVar40 = (uVar31 >> 4) * 4 + (ulong)*(uint *)(pGVar15 + 0x24);
        pGVar33 = pGVar15 + (uVar31 >> 4) * 4 + (ulong)*(uint *)(pGVar15 + 0x24) + 0x2c;
        fVar94 = *(float *)(pGVar33 + 4);
        pGVar32 = pGVar15 + uVar30 * 4 + lVar40 + 0x2c;
        fVar62 = *(float *)(pGVar32 + 4);
        fVar98 = *(float *)(pGVar33 + 8);
        fVar63 = *(float *)(pGVar32 + 8);
        if (uVar30 == 2) {
          fVar98 = fVar94;
          fVar63 = fVar62;
        }
        uVar31 = (ulong)*(uint *)(pGVar15 + 0x14);
        lVar27 = uVar31 * 4 + lVar40;
        fVar135 = *(float *)(pGVar15 + lVar27 + 0x30);
        pGVar1 = pGVar15 + lVar27 + 0x2c + uVar30 * 4;
        fVar120 = *(float *)(pGVar1 + 4);
        fVar139 = *(float *)(pGVar15 + lVar27 + 0x34);
        fVar121 = *(float *)(pGVar1 + 8);
        if (uVar30 == 2) {
          fVar139 = fVar135;
          fVar121 = fVar120;
        }
        lVar28 = uVar31 * 8 + lVar40;
        fVar147 = *(float *)(pGVar15 + lVar28 + 0x30);
        pGVar18 = pGVar15 + lVar28 + 0x2c + uVar30 * 4;
        fVar172 = *(float *)(pGVar18 + 4);
        fVar173 = *(float *)(pGVar18 + 8);
        fVar153 = *(float *)(pGVar15 + lVar28 + 0x34);
        if (uVar30 == 2) {
          fVar173 = fVar172;
          fVar153 = fVar147;
        }
        uVar34 = *(uint *)(pGVar15 + 0x10);
        local_9c0 = pGVar15 + uVar31 * 0xc + lVar40 + 0x2c;
        uVar14 = *(uint *)(pGVar15 + 0x18);
        uVar39 = *(undefined4 *)(pGVar15 + 0x1c);
        fVar10 = *(float *)(ray + k * 4);
        fVar11 = *(float *)(ray + k * 4 + 0x10);
        fVar87 = *(float *)(ray + k * 4 + 0x20);
        fVar12 = *(float *)(ray + k * 4 + 0x40);
        fVar64 = *(float *)pGVar33 - fVar10;
        fVar83 = *(float *)pGVar32 - fVar10;
        fVar84 = fVar94 - fVar10;
        fVar85 = fVar62 - fVar10;
        fVar162 = *(float *)(pGVar15 + lVar27 + 0x2c) - fVar11;
        fVar164 = *(float *)pGVar1 - fVar11;
        fVar166 = fVar135 - fVar11;
        fVar168 = fVar120 - fVar11;
        fVar174 = *(float *)(pGVar15 + lVar28 + 0x2c) - fVar87;
        fVar176 = *(float *)pGVar18 - fVar87;
        fVar178 = fVar147 - fVar87;
        fVar180 = fVar172 - fVar87;
        fVar86 = fVar94 - fVar10;
        fVar94 = fVar94 - fVar10;
        fVar96 = fVar98 - fVar10;
        fVar98 = fVar98 - fVar10;
        fVar131 = fVar135 - fVar11;
        fVar135 = fVar135 - fVar11;
        fVar137 = fVar139 - fVar11;
        fVar139 = fVar139 - fVar11;
        fVar142 = fVar147 - fVar87;
        fVar147 = fVar147 - fVar87;
        fVar150 = fVar153 - fVar87;
        fVar153 = fVar153 - fVar87;
        fVar45 = *(float *)pGVar32 - fVar10;
        fVar61 = fVar62 - fVar10;
        fVar62 = fVar62 - fVar10;
        fVar63 = fVar63 - fVar10;
        fVar112 = *(float *)pGVar1 - fVar11;
        fVar119 = fVar120 - fVar11;
        fVar120 = fVar120 - fVar11;
        fVar121 = fVar121 - fVar11;
        fVar170 = *(float *)pGVar18 - fVar87;
        fVar171 = fVar172 - fVar87;
        fVar172 = fVar172 - fVar87;
        fVar173 = fVar173 - fVar87;
        fVar143 = fVar45 - fVar64;
        fVar148 = fVar61 - fVar83;
        fVar151 = fVar62 - fVar84;
        fVar154 = fVar63 - fVar85;
        fVar87 = fVar112 - fVar162;
        fVar95 = fVar119 - fVar164;
        fVar97 = fVar120 - fVar166;
        fVar99 = fVar121 - fVar168;
        fVar182 = fVar170 - fVar174;
        fVar183 = fVar171 - fVar176;
        fVar184 = fVar172 - fVar178;
        fVar185 = fVar173 - fVar180;
        fVar10 = *(float *)(ray + k * 4 + 0x50);
        fVar11 = *(float *)(ray + k * 4 + 0x60);
        fVar132 = fVar64 - fVar86;
        fVar136 = fVar83 - fVar94;
        fVar138 = fVar84 - fVar96;
        fVar140 = fVar85 - fVar98;
        fVar157 = (fVar87 * (fVar170 + fVar174) - (fVar112 + fVar162) * fVar182) * fVar12 +
                  ((fVar45 + fVar64) * fVar182 - (fVar170 + fVar174) * fVar143) * fVar10 +
                  (fVar143 * (fVar112 + fVar162) - (fVar45 + fVar64) * fVar87) * fVar11;
        fVar160 = (fVar95 * (fVar171 + fVar176) - (fVar119 + fVar164) * fVar183) * fVar12 +
                  ((fVar61 + fVar83) * fVar183 - (fVar171 + fVar176) * fVar148) * fVar10 +
                  (fVar148 * (fVar119 + fVar164) - (fVar61 + fVar83) * fVar95) * fVar11;
        local_898._0_8_ = CONCAT44(fVar160,fVar157);
        local_898._8_4_ =
             (fVar97 * (fVar172 + fVar178) - (fVar120 + fVar166) * fVar184) * fVar12 +
             ((fVar62 + fVar84) * fVar184 - (fVar172 + fVar178) * fVar151) * fVar10 +
             (fVar151 * (fVar120 + fVar166) - (fVar62 + fVar84) * fVar97) * fVar11;
        local_898._12_4_ =
             (fVar99 * (fVar173 + fVar180) - (fVar121 + fVar168) * fVar185) * fVar12 +
             ((fVar63 + fVar85) * fVar185 - (fVar173 + fVar180) * fVar154) * fVar10 +
             (fVar154 * (fVar121 + fVar168) - (fVar63 + fVar85) * fVar99) * fVar11;
        fVar144 = fVar162 - fVar131;
        fVar149 = fVar164 - fVar135;
        fVar152 = fVar166 - fVar137;
        fVar155 = fVar168 - fVar139;
        local_888 = fVar174 - fVar142;
        fStack_884 = fVar176 - fVar147;
        fStack_880 = fVar178 - fVar150;
        fStack_87c = fVar180 - fVar153;
        fVar163 = (fVar144 * (fVar174 + fVar142) - (fVar162 + fVar131) * local_888) * fVar12 +
                  ((fVar64 + fVar86) * local_888 - (fVar174 + fVar142) * fVar132) * fVar10 +
                  (fVar132 * (fVar162 + fVar131) - (fVar64 + fVar86) * fVar144) * fVar11;
        fVar165 = (fVar149 * (fVar176 + fVar147) - (fVar164 + fVar135) * fStack_884) * fVar12 +
                  ((fVar83 + fVar94) * fStack_884 - (fVar176 + fVar147) * fVar136) * fVar10 +
                  (fVar136 * (fVar164 + fVar135) - (fVar83 + fVar94) * fVar149) * fVar11;
        fVar167 = (fVar152 * (fVar178 + fVar150) - (fVar166 + fVar137) * fStack_880) * fVar12 +
                  ((fVar84 + fVar96) * fStack_880 - (fVar178 + fVar150) * fVar138) * fVar10 +
                  (fVar138 * (fVar166 + fVar137) - (fVar84 + fVar96) * fVar152) * fVar11;
        fVar169 = (fVar155 * (fVar180 + fVar153) - (fVar168 + fVar139) * fStack_87c) * fVar12 +
                  ((fVar85 + fVar98) * fStack_87c - (fVar180 + fVar153) * fVar140) * fVar10 +
                  (fVar140 * (fVar168 + fVar139) - (fVar85 + fVar98) * fVar155) * fVar11;
        fVar123 = fVar86 - fVar45;
        fVar126 = fVar94 - fVar61;
        fVar127 = fVar96 - fVar62;
        fVar128 = fVar98 - fVar63;
        fVar100 = fVar131 - fVar112;
        fVar108 = fVar135 - fVar119;
        fVar110 = fVar137 - fVar120;
        fVar111 = fVar139 - fVar121;
        fVar175 = fVar142 - fVar170;
        fVar177 = fVar147 - fVar171;
        fVar179 = fVar150 - fVar172;
        fVar181 = fVar153 - fVar173;
        auVar70._0_4_ =
             (fVar100 * (fVar170 + fVar142) - (fVar112 + fVar131) * fVar175) * fVar12 +
             ((fVar45 + fVar86) * fVar175 - (fVar170 + fVar142) * fVar123) * fVar10 +
             (fVar123 * (fVar112 + fVar131) - (fVar45 + fVar86) * fVar100) * fVar11;
        auVar70._4_4_ =
             (fVar108 * (fVar171 + fVar147) - (fVar119 + fVar135) * fVar177) * fVar12 +
             ((fVar61 + fVar94) * fVar177 - (fVar171 + fVar147) * fVar126) * fVar10 +
             (fVar126 * (fVar119 + fVar135) - (fVar61 + fVar94) * fVar108) * fVar11;
        auVar70._8_4_ =
             (fVar110 * (fVar172 + fVar150) - (fVar120 + fVar137) * fVar179) * fVar12 +
             ((fVar62 + fVar96) * fVar179 - (fVar172 + fVar150) * fVar127) * fVar10 +
             (fVar127 * (fVar120 + fVar137) - (fVar62 + fVar96) * fVar110) * fVar11;
        auVar70._12_4_ =
             (fVar111 * (fVar173 + fVar153) - (fVar121 + fVar139) * fVar181) * fVar12 +
             ((fVar63 + fVar98) * fVar181 - (fVar173 + fVar153) * fVar128) * fVar10 +
             (fVar128 * (fVar121 + fVar139) - (fVar63 + fVar98) * fVar111) * fVar11;
        local_8a8._0_4_ = fVar157 + fVar163 + auVar70._0_4_;
        local_8a8._4_4_ = fVar160 + fVar165 + auVar70._4_4_;
        local_8a8._8_4_ = local_898._8_4_ + fVar167 + auVar70._8_4_;
        local_8a8._12_4_ = local_898._12_4_ + fVar169 + auVar70._12_4_;
        auVar47._8_4_ = local_898._8_4_;
        auVar47._0_8_ = local_898._0_8_;
        auVar47._12_4_ = local_898._12_4_;
        auVar21._4_4_ = fVar165;
        auVar21._0_4_ = fVar163;
        auVar21._8_4_ = fVar167;
        auVar21._12_4_ = fVar169;
        auVar67 = minps(auVar47,auVar21);
        auVar67 = minps(auVar67,auVar70);
        auVar22._4_4_ = fVar165;
        auVar22._0_4_ = fVar163;
        auVar22._8_4_ = fVar167;
        auVar22._12_4_ = fVar169;
        auVar46 = maxps(local_898,auVar22);
        auVar46 = maxps(auVar46,auVar70);
        auVar158._4_4_ = -(uint)(auVar46._4_4_ <= ABS(local_8a8._4_4_) * 1.1920929e-07);
        auVar158._0_4_ = -(uint)(auVar46._0_4_ <= ABS(local_8a8._0_4_) * 1.1920929e-07);
        auVar158._8_4_ = -(uint)(auVar46._8_4_ <= ABS(local_8a8._8_4_) * 1.1920929e-07);
        auVar158._12_4_ = -(uint)(auVar46._12_4_ <= ABS(local_8a8._12_4_) * 1.1920929e-07);
        auVar48._4_4_ = -(uint)(-(ABS(local_8a8._4_4_) * 1.1920929e-07) <= auVar67._4_4_);
        auVar48._0_4_ = -(uint)(-(ABS(local_8a8._0_4_) * 1.1920929e-07) <= auVar67._0_4_);
        auVar48._8_4_ = -(uint)(-(ABS(local_8a8._8_4_) * 1.1920929e-07) <= auVar67._8_4_);
        auVar48._12_4_ = -(uint)(-(ABS(local_8a8._12_4_) * 1.1920929e-07) <= auVar67._12_4_);
        auVar158 = auVar158 | auVar48;
        iVar35 = movmskps((int)&local_9c0,auVar158);
        local_9c4 = uVar39;
        if (iVar35 == 0) {
LAB_002a720c:
          if (2 < uVar34) {
            lVar40 = uVar30 * 4 + lVar40;
            pGVar32 = pGVar15 + lVar40 + 0x2c;
            fVar94 = *(float *)(pGVar15 + lVar40 + 0x30);
            pGVar33 = pGVar32 + uVar30 * 4;
            fVar62 = *(float *)(pGVar33 + 4);
            fVar98 = *(float *)(pGVar15 + lVar40 + 0x34);
            fVar63 = *(float *)(pGVar33 + 8);
            if (uVar30 == 2) {
              fVar98 = fVar94;
              fVar63 = fVar62;
            }
            pGVar18 = (local_9d0->super_Precalculations).grid;
            uVar31 = (ulong)*(uint *)(pGVar18 + 0x14);
            pGVar15 = pGVar32 + uVar31 * 4;
            fVar135 = *(float *)(pGVar15 + 4);
            pGVar1 = pGVar15 + uVar30 * 4;
            fVar120 = *(float *)(pGVar1 + 4);
            fVar139 = *(float *)(pGVar15 + 8);
            fVar121 = *(float *)(pGVar1 + 8);
            if (uVar30 == 2) {
              fVar139 = fVar135;
              fVar121 = fVar120;
            }
            pGVar2 = pGVar32 + uVar31 * 8;
            fVar147 = *(float *)(pGVar2 + 4);
            pGVar3 = pGVar2 + uVar30 * 4;
            fVar172 = *(float *)(pGVar3 + 4);
            fVar173 = *(float *)(pGVar3 + 8);
            fVar153 = *(float *)(pGVar2 + 8);
            if (uVar30 == 2) {
              fVar173 = fVar172;
              fVar153 = fVar147;
            }
            local_9c0 = pGVar32 + uVar31 * 0xc;
            uVar14 = *(uint *)(pGVar18 + 0x18);
            uVar39 = *(undefined4 *)(pGVar18 + 0x1c);
            fVar10 = *(float *)(ray + k * 4);
            fVar11 = *(float *)(ray + k * 4 + 0x10);
            fVar87 = *(float *)(ray + k * 4 + 0x20);
            fVar12 = *(float *)(ray + k * 4 + 0x40);
            fVar64 = *(float *)pGVar32 - fVar10;
            fVar83 = *(float *)pGVar33 - fVar10;
            fVar84 = fVar94 - fVar10;
            fVar85 = fVar62 - fVar10;
            local_9a8 = *(float *)pGVar15 - fVar11;
            fStack_9a4 = *(float *)pGVar1 - fVar11;
            fStack_9a0 = fVar135 - fVar11;
            fStack_99c = fVar120 - fVar11;
            fVar168 = *(float *)pGVar2 - fVar87;
            fVar170 = *(float *)pGVar3 - fVar87;
            fVar174 = fVar147 - fVar87;
            fVar176 = fVar172 - fVar87;
            fVar86 = fVar94 - fVar10;
            fVar94 = fVar94 - fVar10;
            fVar96 = fVar98 - fVar10;
            fVar98 = fVar98 - fVar10;
            fVar131 = fVar135 - fVar11;
            fVar135 = fVar135 - fVar11;
            fVar137 = fVar139 - fVar11;
            fVar139 = fVar139 - fVar11;
            fVar142 = fVar147 - fVar87;
            fVar147 = fVar147 - fVar87;
            fVar150 = fVar153 - fVar87;
            fVar153 = fVar153 - fVar87;
            fVar45 = *(float *)pGVar33 - fVar10;
            fVar61 = fVar62 - fVar10;
            fVar62 = fVar62 - fVar10;
            fVar63 = fVar63 - fVar10;
            fVar112 = *(float *)pGVar1 - fVar11;
            fVar119 = fVar120 - fVar11;
            fVar120 = fVar120 - fVar11;
            fVar121 = fVar121 - fVar11;
            fVar166 = *(float *)pGVar3 - fVar87;
            fVar167 = fVar172 - fVar87;
            fVar172 = fVar172 - fVar87;
            fVar173 = fVar173 - fVar87;
            fVar143 = fVar45 - fVar64;
            fVar148 = fVar61 - fVar83;
            fVar151 = fVar62 - fVar84;
            fVar154 = fVar63 - fVar85;
            fVar87 = fVar112 - local_9a8;
            fVar95 = fVar119 - fStack_9a4;
            fVar97 = fVar120 - fStack_9a0;
            fVar99 = fVar121 - fStack_99c;
            fVar178 = fVar166 - fVar168;
            fVar179 = fVar167 - fVar170;
            fVar180 = fVar172 - fVar174;
            fVar181 = fVar173 - fVar176;
            fVar10 = *(float *)(ray + k * 4 + 0x50);
            fVar11 = *(float *)(ray + k * 4 + 0x60);
            fVar132 = fVar64 - fVar86;
            fVar136 = fVar83 - fVar94;
            fVar138 = fVar84 - fVar96;
            fVar140 = fVar85 - fVar98;
            fVar157 = (fVar87 * (fVar166 + fVar168) - (fVar112 + local_9a8) * fVar178) * fVar12 +
                      ((fVar45 + fVar64) * fVar178 - (fVar166 + fVar168) * fVar143) * fVar10 +
                      (fVar143 * (fVar112 + local_9a8) - (fVar45 + fVar64) * fVar87) * fVar11;
            fVar160 = (fVar95 * (fVar167 + fVar170) - (fVar119 + fStack_9a4) * fVar179) * fVar12 +
                      ((fVar61 + fVar83) * fVar179 - (fVar167 + fVar170) * fVar148) * fVar10 +
                      (fVar148 * (fVar119 + fStack_9a4) - (fVar61 + fVar83) * fVar95) * fVar11;
            local_898._0_8_ = CONCAT44(fVar160,fVar157);
            local_898._8_4_ =
                 (fVar97 * (fVar172 + fVar174) - (fVar120 + fStack_9a0) * fVar180) * fVar12 +
                 ((fVar62 + fVar84) * fVar180 - (fVar172 + fVar174) * fVar151) * fVar10 +
                 (fVar151 * (fVar120 + fStack_9a0) - (fVar62 + fVar84) * fVar97) * fVar11;
            local_898._12_4_ =
                 (fVar99 * (fVar173 + fVar176) - (fVar121 + fStack_99c) * fVar181) * fVar12 +
                 ((fVar63 + fVar85) * fVar181 - (fVar173 + fVar176) * fVar154) * fVar10 +
                 (fVar154 * (fVar121 + fStack_99c) - (fVar63 + fVar85) * fVar99) * fVar11;
            fVar144 = local_9a8 - fVar131;
            fVar149 = fStack_9a4 - fVar135;
            fVar152 = fStack_9a0 - fVar137;
            fVar155 = fStack_99c - fVar139;
            local_888 = fVar168 - fVar142;
            fStack_884 = fVar170 - fVar147;
            fStack_880 = fVar174 - fVar150;
            fStack_87c = fVar176 - fVar153;
            fVar162 = (fVar144 * (fVar168 + fVar142) - (local_9a8 + fVar131) * local_888) * fVar12 +
                      ((fVar64 + fVar86) * local_888 - (fVar168 + fVar142) * fVar132) * fVar10 +
                      (fVar132 * (local_9a8 + fVar131) - (fVar64 + fVar86) * fVar144) * fVar11;
            fVar163 = (fVar149 * (fVar170 + fVar147) - (fStack_9a4 + fVar135) * fStack_884) * fVar12
                      + ((fVar83 + fVar94) * fStack_884 - (fVar170 + fVar147) * fVar136) * fVar10 +
                        (fVar136 * (fStack_9a4 + fVar135) - (fVar83 + fVar94) * fVar149) * fVar11;
            fVar164 = (fVar152 * (fVar174 + fVar150) - (fStack_9a0 + fVar137) * fStack_880) * fVar12
                      + ((fVar84 + fVar96) * fStack_880 - (fVar174 + fVar150) * fVar138) * fVar10 +
                        (fVar138 * (fStack_9a0 + fVar137) - (fVar84 + fVar96) * fVar152) * fVar11;
            fVar165 = (fVar155 * (fVar176 + fVar153) - (fStack_99c + fVar139) * fStack_87c) * fVar12
                      + ((fVar85 + fVar98) * fStack_87c - (fVar176 + fVar153) * fVar140) * fVar10 +
                        (fVar140 * (fStack_99c + fVar139) - (fVar85 + fVar98) * fVar155) * fVar11;
            fVar123 = fVar86 - fVar45;
            fVar126 = fVar94 - fVar61;
            fVar127 = fVar96 - fVar62;
            fVar128 = fVar98 - fVar63;
            fVar100 = fVar131 - fVar112;
            fVar108 = fVar135 - fVar119;
            fVar110 = fVar137 - fVar120;
            fVar111 = fVar139 - fVar121;
            fVar169 = fVar142 - fVar166;
            fVar171 = fVar147 - fVar167;
            fVar175 = fVar150 - fVar172;
            fVar177 = fVar153 - fVar173;
            auVar77._0_4_ =
                 (fVar100 * (fVar166 + fVar142) - (fVar112 + fVar131) * fVar169) * fVar12 +
                 ((fVar45 + fVar86) * fVar169 - (fVar166 + fVar142) * fVar123) * fVar10 +
                 (fVar123 * (fVar112 + fVar131) - (fVar45 + fVar86) * fVar100) * fVar11;
            auVar77._4_4_ =
                 (fVar108 * (fVar167 + fVar147) - (fVar119 + fVar135) * fVar171) * fVar12 +
                 ((fVar61 + fVar94) * fVar171 - (fVar167 + fVar147) * fVar126) * fVar10 +
                 (fVar126 * (fVar119 + fVar135) - (fVar61 + fVar94) * fVar108) * fVar11;
            auVar77._8_4_ =
                 (fVar110 * (fVar172 + fVar150) - (fVar120 + fVar137) * fVar175) * fVar12 +
                 ((fVar62 + fVar96) * fVar175 - (fVar172 + fVar150) * fVar127) * fVar10 +
                 (fVar127 * (fVar120 + fVar137) - (fVar62 + fVar96) * fVar110) * fVar11;
            auVar77._12_4_ =
                 (fVar111 * (fVar173 + fVar153) - (fVar121 + fVar139) * fVar177) * fVar12 +
                 ((fVar63 + fVar98) * fVar177 - (fVar173 + fVar153) * fVar128) * fVar10 +
                 (fVar128 * (fVar121 + fVar139) - (fVar63 + fVar98) * fVar111) * fVar11;
            local_8a8._0_4_ = fVar157 + fVar162 + auVar77._0_4_;
            local_8a8._4_4_ = fVar160 + fVar163 + auVar77._4_4_;
            local_8a8._8_4_ = local_898._8_4_ + fVar164 + auVar77._8_4_;
            local_8a8._12_4_ = local_898._12_4_ + fVar165 + auVar77._12_4_;
            auVar54._8_4_ = local_898._8_4_;
            auVar54._0_8_ = local_898._0_8_;
            auVar54._12_4_ = local_898._12_4_;
            auVar23._4_4_ = fVar163;
            auVar23._0_4_ = fVar162;
            auVar23._8_4_ = fVar164;
            auVar23._12_4_ = fVar165;
            auVar67 = minps(auVar54,auVar23);
            auVar67 = minps(auVar67,auVar77);
            auVar24._4_4_ = fVar163;
            auVar24._0_4_ = fVar162;
            auVar24._8_4_ = fVar164;
            auVar24._12_4_ = fVar165;
            auVar46 = maxps(local_898,auVar24);
            auVar46 = maxps(auVar46,auVar77);
            auVar159._4_4_ = -(uint)(auVar46._4_4_ <= ABS(local_8a8._4_4_) * 1.1920929e-07);
            auVar159._0_4_ = -(uint)(auVar46._0_4_ <= ABS(local_8a8._0_4_) * 1.1920929e-07);
            auVar159._8_4_ = -(uint)(auVar46._8_4_ <= ABS(local_8a8._8_4_) * 1.1920929e-07);
            auVar159._12_4_ = -(uint)(auVar46._12_4_ <= ABS(local_8a8._12_4_) * 1.1920929e-07);
            auVar55._4_4_ = -(uint)(-(ABS(local_8a8._4_4_) * 1.1920929e-07) <= auVar67._4_4_);
            auVar55._0_4_ = -(uint)(-(ABS(local_8a8._0_4_) * 1.1920929e-07) <= auVar67._0_4_);
            auVar55._8_4_ = -(uint)(-(ABS(local_8a8._8_4_) * 1.1920929e-07) <= auVar67._8_4_);
            auVar55._12_4_ = -(uint)(-(ABS(local_8a8._12_4_) * 1.1920929e-07) <= auVar67._12_4_);
            auVar159 = auVar159 | auVar55;
            iVar35 = movmskps((int)&local_9c0,auVar159);
            if (iVar35 != 0) {
              auVar117._0_4_ = fVar87 * local_888 - fVar144 * fVar178;
              auVar117._4_4_ = fVar95 * fStack_884 - fVar149 * fVar179;
              auVar117._8_4_ = fVar97 * fStack_880 - fVar152 * fVar180;
              auVar117._12_4_ = fVar99 * fStack_87c - fVar155 * fVar181;
              auVar146._0_4_ = fVar144 * fVar169 - fVar100 * local_888;
              auVar146._4_4_ = fVar149 * fVar171 - fVar108 * fStack_884;
              auVar146._8_4_ = fVar152 * fVar175 - fVar110 * fStack_880;
              auVar146._12_4_ = fVar155 * fVar177 - fVar111 * fStack_87c;
              auVar56._4_4_ = -(uint)(ABS(fVar149 * fVar179) < ABS(fVar108 * fStack_884));
              auVar56._0_4_ = -(uint)(ABS(fVar144 * fVar178) < ABS(fVar100 * local_888));
              auVar56._8_4_ = -(uint)(ABS(fVar152 * fVar180) < ABS(fVar110 * fStack_880));
              auVar56._12_4_ = -(uint)(ABS(fVar155 * fVar181) < ABS(fVar111 * fStack_87c));
              local_8d8 = blendvps(auVar146,auVar117,auVar56);
              auVar125._0_4_ = fVar123 * local_888 - fVar132 * fVar169;
              auVar125._4_4_ = fVar126 * fStack_884 - fVar136 * fVar171;
              auVar125._8_4_ = fVar127 * fStack_880 - fVar138 * fVar175;
              auVar125._12_4_ = fVar128 * fStack_87c - fVar140 * fVar177;
              auVar57._4_4_ = -(uint)(ABS(fVar148 * fStack_884) < ABS(fVar136 * fVar171));
              auVar57._0_4_ = -(uint)(ABS(fVar143 * local_888) < ABS(fVar132 * fVar169));
              auVar57._8_4_ = -(uint)(ABS(fVar151 * fStack_880) < ABS(fVar138 * fVar175));
              auVar57._12_4_ = -(uint)(ABS(fVar154 * fStack_87c) < ABS(fVar140 * fVar177));
              auVar26._4_4_ = fVar179 * fVar136 - fVar148 * fStack_884;
              auVar26._0_4_ = fVar178 * fVar132 - fVar143 * local_888;
              auVar26._8_4_ = fVar180 * fVar138 - fVar151 * fStack_880;
              auVar26._12_4_ = fVar181 * fVar140 - fVar154 * fStack_87c;
              local_8c8 = blendvps(auVar125,auVar26,auVar57);
              auVar134._0_4_ = fVar132 * fVar100 - fVar123 * fVar144;
              auVar134._4_4_ = fVar136 * fVar108 - fVar126 * fVar149;
              auVar134._8_4_ = fVar138 * fVar110 - fVar127 * fVar152;
              auVar134._12_4_ = fVar140 * fVar111 - fVar128 * fVar155;
              auVar58._4_4_ = -(uint)(ABS(fVar136 * fVar95) < ABS(fVar126 * fVar149));
              auVar58._0_4_ = -(uint)(ABS(fVar132 * fVar87) < ABS(fVar123 * fVar144));
              auVar58._8_4_ = -(uint)(ABS(fVar138 * fVar97) < ABS(fVar127 * fVar152));
              auVar58._12_4_ = -(uint)(ABS(fVar140 * fVar99) < ABS(fVar128 * fVar155));
              auVar20._4_4_ = fVar148 * fVar149 - fVar136 * fVar95;
              auVar20._0_4_ = fVar143 * fVar144 - fVar132 * fVar87;
              auVar20._8_4_ = fVar151 * fVar152 - fVar138 * fVar97;
              auVar20._12_4_ = fVar154 * fVar155 - fVar140 * fVar99;
              local_8b8 = blendvps(auVar134,auVar20,auVar58);
              fVar94 = fVar12 * local_8d8._0_4_ +
                       fVar10 * local_8c8._0_4_ + fVar11 * local_8b8._0_4_;
              fVar62 = fVar12 * local_8d8._4_4_ +
                       fVar10 * local_8c8._4_4_ + fVar11 * local_8b8._4_4_;
              fVar98 = fVar12 * local_8d8._8_4_ +
                       fVar10 * local_8c8._8_4_ + fVar11 * local_8b8._8_4_;
              fVar63 = fVar12 * local_8d8._12_4_ +
                       fVar10 * local_8c8._12_4_ + fVar11 * local_8b8._12_4_;
              auVar106._0_4_ = fVar94 + fVar94;
              auVar106._4_4_ = fVar62 + fVar62;
              auVar106._8_4_ = fVar98 + fVar98;
              auVar106._12_4_ = fVar63 + fVar63;
              auVar78._0_4_ = local_9a8 * local_8c8._0_4_ + fVar168 * local_8b8._0_4_;
              auVar78._4_4_ = fStack_9a4 * local_8c8._4_4_ + fVar170 * local_8b8._4_4_;
              auVar78._8_4_ = fStack_9a0 * local_8c8._8_4_ + fVar174 * local_8b8._8_4_;
              auVar78._12_4_ = fStack_99c * local_8c8._12_4_ + fVar176 * local_8b8._12_4_;
              fVar135 = fVar64 * local_8d8._0_4_ + auVar78._0_4_;
              fVar120 = fVar83 * local_8d8._4_4_ + auVar78._4_4_;
              fVar139 = fVar84 * local_8d8._8_4_ + auVar78._8_4_;
              fVar121 = fVar85 * local_8d8._12_4_ + auVar78._12_4_;
              auVar67 = rcpps(auVar78,auVar106);
              fVar94 = auVar67._0_4_;
              fVar62 = auVar67._4_4_;
              fVar98 = auVar67._8_4_;
              fVar63 = auVar67._12_4_;
              local_8e8._0_4_ =
                   ((1.0 - auVar106._0_4_ * fVar94) * fVar94 + fVar94) * (fVar135 + fVar135);
              local_8e8._4_4_ =
                   ((1.0 - auVar106._4_4_ * fVar62) * fVar62 + fVar62) * (fVar120 + fVar120);
              local_8e8._8_4_ =
                   ((1.0 - auVar106._8_4_ * fVar98) * fVar98 + fVar98) * (fVar139 + fVar139);
              local_8e8._12_4_ =
                   ((1.0 - auVar106._12_4_ * fVar63) * fVar63 + fVar63) * (fVar121 + fVar121);
              fVar94 = *(float *)(ray + k * 4 + 0x80);
              fVar62 = *(float *)(ray + k * 4 + 0x30);
              auVar79._0_4_ =
                   -(uint)(local_8e8._0_4_ <= fVar94 && fVar62 <= local_8e8._0_4_) & auVar159._0_4_;
              auVar79._4_4_ =
                   -(uint)(local_8e8._4_4_ <= fVar94 && fVar62 <= local_8e8._4_4_) & auVar159._4_4_;
              auVar79._8_4_ =
                   -(uint)(local_8e8._8_4_ <= fVar94 && fVar62 <= local_8e8._8_4_) & auVar159._8_4_;
              auVar79._12_4_ =
                   -(uint)(local_8e8._12_4_ <= fVar94 && fVar62 <= local_8e8._12_4_) &
                   auVar159._12_4_;
              iVar35 = movmskps(iVar35,auVar79);
              if (iVar35 != 0) {
                auVar80._0_4_ = auVar79._0_4_ & -(uint)(auVar106._0_4_ != 0.0);
                auVar80._4_4_ = auVar79._4_4_ & -(uint)(auVar106._4_4_ != 0.0);
                auVar80._8_4_ = auVar79._8_4_ & -(uint)(auVar106._8_4_ != 0.0);
                auVar80._12_4_ = auVar79._12_4_ & -(uint)(auVar106._12_4_ != 0.0);
                iVar35 = movmskps(iVar35,auVar80);
                if (iVar35 != 0) {
                  pGVar16 = (context->scene->geometries).items[uVar14].ptr;
                  if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002a779a;
                    auVar67 = rcpps(local_8a8,local_8a8);
                    fVar94 = auVar67._0_4_;
                    fVar62 = auVar67._4_4_;
                    fVar98 = auVar67._8_4_;
                    fVar63 = auVar67._12_4_;
                    fVar94 = (float)(-(uint)(1e-18 <= ABS(local_8a8._0_4_)) &
                                    (uint)(((float)DAT_01feca10 - local_8a8._0_4_ * fVar94) * fVar94
                                          + fVar94));
                    fVar62 = (float)(-(uint)(1e-18 <= ABS(local_8a8._4_4_)) &
                                    (uint)((DAT_01feca10._4_4_ - local_8a8._4_4_ * fVar62) * fVar62
                                          + fVar62));
                    fVar98 = (float)(-(uint)(1e-18 <= ABS(local_8a8._8_4_)) &
                                    (uint)((DAT_01feca10._8_4_ - local_8a8._8_4_ * fVar98) * fVar98
                                          + fVar98));
                    fVar63 = (float)(-(uint)(1e-18 <= ABS(local_8a8._12_4_)) &
                                    (uint)((DAT_01feca10._12_4_ - local_8a8._12_4_ * fVar63) *
                                           fVar63 + fVar63));
                    auVar81._0_4_ = fVar157 * fVar94;
                    auVar81._4_4_ = fVar160 * fVar62;
                    auVar81._8_4_ = local_898._8_4_ * fVar98;
                    auVar81._12_4_ = local_898._12_4_ * fVar63;
                    auVar75 = minps(auVar81,_DAT_01feca10);
                    auVar59._0_4_ = fVar94 * fVar162;
                    auVar59._4_4_ = fVar62 * fVar163;
                    auVar59._8_4_ = fVar98 * fVar164;
                    auVar59._12_4_ = fVar63 * fVar165;
                    auVar69 = minps(auVar59,_DAT_01feca10);
                    auVar67 = *(undefined1 (*) [16])local_9c0;
                    auVar114 = auVar67._0_12_;
                    auVar46 = *(undefined1 (*) [16])(local_9c0 + uVar30 * 4);
                    auVar103 = auVar46._0_12_;
                    if (uVar30 == 2) {
                      auVar114._0_8_ = auVar67._0_8_;
                      auVar114._8_4_ = auVar67._4_4_;
                      auVar103._0_8_ = auVar46._0_8_;
                      auVar103._8_4_ = auVar46._4_4_;
                    }
                    auVar118._4_4_ = auVar114._4_4_;
                    auVar118._8_4_ = auVar114._8_4_;
                    auVar93._0_8_ = auVar114._0_8_;
                    auVar93._8_4_ = auVar118._4_4_;
                    uVar109 = auVar103._4_4_;
                    auVar93._12_4_ = uVar109;
                    auVar92._8_8_ = auVar93._8_8_;
                    auVar92._0_4_ = auVar114._0_4_;
                    uVar101 = auVar103._0_4_;
                    auVar92._4_4_ = uVar101;
                    auVar118._0_4_ = auVar118._4_4_;
                    auVar118._12_4_ = auVar118._8_4_;
                    auVar107._0_8_ = auVar103._0_8_;
                    auVar107._8_4_ = uVar109;
                    auVar107._12_4_ = auVar103._8_4_;
                    pblendw(auVar92,ZEXT816(0),0xaa);
                    pblendw(auVar118,ZEXT816(0),0xaa);
                    pblendw(auVar107,ZEXT816(0),0xaa);
                    local_8f8[1] = ((1.0 - auVar75._4_4_) - auVar69._4_4_) *
                                   (float)(uVar101 >> 0x10) * 0.00012207031 +
                                   (float)(uVar109 >> 0x10) * 0.00012207031 * auVar69._4_4_ +
                                   (float)(auVar118._4_4_ >> 0x10) * 0.00012207031 * auVar75._4_4_;
                    local_8f8[0] = ((1.0 - auVar75._0_4_) - auVar69._0_4_) *
                                   (float)(auVar92._0_4_ >> 0x10) * 0.00012207031 +
                                   (float)(uVar101 >> 0x10) * 0.00012207031 * auVar69._0_4_ +
                                   (float)(auVar118._4_4_ >> 0x10) * 0.00012207031 * auVar75._0_4_;
                    local_8f8[2] = ((1.0 - auVar75._8_4_) - auVar69._8_4_) *
                                   (float)(auVar118._4_4_ >> 0x10) * 0.00012207031 +
                                   (float)(uVar109 >> 0x10) * 0.00012207031 * auVar69._8_4_ +
                                   (float)(auVar118._8_4_ >> 0x10) * 0.00012207031 * auVar75._8_4_;
                    local_8f8[3] = ((1.0 - auVar75._12_4_) - auVar69._12_4_) *
                                   (float)(uVar109 >> 0x10) * 0.00012207031 +
                                   (float)(auVar103._8_4_ >> 0x10) * 0.00012207031 * auVar69._12_4_
                                   + (float)(auVar118._8_4_ >> 0x10) * 0.00012207031 *
                                     auVar75._12_4_;
                    iVar35 = movmskps((int)uVar30,auVar80);
                    uVar41 = CONCAT44((int)(uVar30 >> 0x20),iVar35);
                    uVar31 = 0;
                    if (uVar41 != 0) {
                      for (; (uVar41 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                      }
                    }
                    bVar44 = iVar35 == 0;
                    if (!bVar44) {
                      local_af8 = CONCAT44(uVar14,uVar14);
                      auVar113 = *local_990;
                      uStack_9ec = (undefined4)((ulong)*(undefined8 *)(*local_990 + 8) >> 0x20);
                      local_9b8 = uVar30;
                      local_9b0 = (ulong)uVar34;
                      do {
                        uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_838 = local_8f8[uVar31 - 4];
                        fVar94 = local_8f8[uVar31];
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_8e8 + uVar31 * 4);
                        args.context = context->user;
                        local_828._4_4_ = fVar94;
                        local_828._0_4_ = fVar94;
                        local_828._8_4_ = fVar94;
                        local_828._12_4_ = fVar94;
                        local_868 = *(undefined4 *)(local_8d8 + uVar31 * 4);
                        local_858 = *(undefined4 *)(local_8c8 + uVar31 * 4);
                        local_848 = *(undefined4 *)(local_8b8 + uVar31 * 4);
                        uStack_864 = local_868;
                        uStack_860 = local_868;
                        uStack_85c = local_868;
                        uStack_854 = local_858;
                        uStack_850 = local_858;
                        uStack_84c = local_858;
                        uStack_844 = local_848;
                        uStack_840 = local_848;
                        uStack_83c = local_848;
                        fStack_834 = local_838;
                        fStack_830 = local_838;
                        fStack_82c = local_838;
                        local_818 = CONCAT44(uVar39,uVar39);
                        uStack_810 = CONCAT44(uVar39,uVar39);
                        local_808 = local_af8;
                        uStack_800 = CONCAT44(uVar14,uVar14);
                        local_7f8 = (args.context)->instID[0];
                        uStack_7f4 = local_7f8;
                        uStack_7f0 = local_7f8;
                        uStack_7ec = local_7f8;
                        local_7e8 = (args.context)->instPrimID[0];
                        uStack_7e4 = local_7e8;
                        uStack_7e0 = local_7e8;
                        uStack_7dc = local_7e8;
                        local_9e8._12_4_ = uStack_9ec;
                        local_9e8._0_12_ = auVar113;
                        args.valid = (int *)local_9e8;
                        args.geometryUserPtr = pGVar16->userPtr;
                        args.hit = (RTCHitN *)&local_868;
                        args.N = 4;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar16->occlusionFilterN)(&args);
                        }
                        if (local_9e8 == (undefined1  [16])0x0) {
                          auVar82._8_4_ = 0xffffffff;
                          auVar82._0_8_ = 0xffffffffffffffff;
                          auVar82._12_4_ = 0xffffffff;
                          auVar82 = auVar82 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var17)(&args);
                          }
                          auVar60._0_4_ = -(uint)(local_9e8._0_4_ == 0);
                          auVar60._4_4_ = -(uint)(local_9e8._4_4_ == 0);
                          auVar60._8_4_ = -(uint)(local_9e8._8_4_ == 0);
                          auVar60._12_4_ = -(uint)(local_9e8._12_4_ == 0);
                          auVar82 = auVar60 ^ _DAT_01febe20;
                          auVar67 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                             auVar60);
                          *(undefined1 (*) [16])(args.ray + 0x80) = auVar67;
                        }
                        if ((_DAT_01fecb20 & auVar82) != (undefined1  [16])0x0) {
                          if (!bVar44) {
                            bVar44 = true;
                            sVar37 = 0;
                            goto LAB_002a77fc;
                          }
                          break;
                        }
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar13;
                        uVar41 = uVar41 ^ 1L << (uVar31 & 0x3f);
                        uVar31 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                          }
                        }
                        bVar44 = uVar41 == 0;
                      } while (!bVar44);
                    }
                  }
                }
              }
            }
          }
          sVar37 = 0;
          goto LAB_002a7892;
        }
        auVar115._0_4_ = fVar87 * local_888 - fVar144 * fVar182;
        auVar115._4_4_ = fVar95 * fStack_884 - fVar149 * fVar183;
        auVar115._8_4_ = fVar97 * fStack_880 - fVar152 * fVar184;
        auVar115._12_4_ = fVar99 * fStack_87c - fVar155 * fVar185;
        auVar145._0_4_ = fVar144 * fVar175 - fVar100 * local_888;
        auVar145._4_4_ = fVar149 * fVar177 - fVar108 * fStack_884;
        auVar145._8_4_ = fVar152 * fVar179 - fVar110 * fStack_880;
        auVar145._12_4_ = fVar155 * fVar181 - fVar111 * fStack_87c;
        auVar49._4_4_ = -(uint)(ABS(fVar149 * fVar183) < ABS(fVar108 * fStack_884));
        auVar49._0_4_ = -(uint)(ABS(fVar144 * fVar182) < ABS(fVar100 * local_888));
        auVar49._8_4_ = -(uint)(ABS(fVar152 * fVar184) < ABS(fVar110 * fStack_880));
        auVar49._12_4_ = -(uint)(ABS(fVar155 * fVar185) < ABS(fVar111 * fStack_87c));
        local_8d8 = blendvps(auVar145,auVar115,auVar49);
        auVar124._0_4_ = fVar123 * local_888 - fVar132 * fVar175;
        auVar124._4_4_ = fVar126 * fStack_884 - fVar136 * fVar177;
        auVar124._8_4_ = fVar127 * fStack_880 - fVar138 * fVar179;
        auVar124._12_4_ = fVar128 * fStack_87c - fVar140 * fVar181;
        auVar50._4_4_ = -(uint)(ABS(fVar148 * fStack_884) < ABS(fVar136 * fVar177));
        auVar50._0_4_ = -(uint)(ABS(fVar143 * local_888) < ABS(fVar132 * fVar175));
        auVar50._8_4_ = -(uint)(ABS(fVar151 * fStack_880) < ABS(fVar138 * fVar179));
        auVar50._12_4_ = -(uint)(ABS(fVar154 * fStack_87c) < ABS(fVar140 * fVar181));
        auVar25._4_4_ = fVar183 * fVar136 - fVar148 * fStack_884;
        auVar25._0_4_ = fVar182 * fVar132 - fVar143 * local_888;
        auVar25._8_4_ = fVar184 * fVar138 - fVar151 * fStack_880;
        auVar25._12_4_ = fVar185 * fVar140 - fVar154 * fStack_87c;
        local_8c8 = blendvps(auVar124,auVar25,auVar50);
        auVar133._0_4_ = fVar132 * fVar100 - fVar123 * fVar144;
        auVar133._4_4_ = fVar136 * fVar108 - fVar126 * fVar149;
        auVar133._8_4_ = fVar138 * fVar110 - fVar127 * fVar152;
        auVar133._12_4_ = fVar140 * fVar111 - fVar128 * fVar155;
        auVar51._4_4_ = -(uint)(ABS(fVar136 * fVar95) < ABS(fVar126 * fVar149));
        auVar51._0_4_ = -(uint)(ABS(fVar132 * fVar87) < ABS(fVar123 * fVar144));
        auVar51._8_4_ = -(uint)(ABS(fVar138 * fVar97) < ABS(fVar127 * fVar152));
        auVar51._12_4_ = -(uint)(ABS(fVar140 * fVar99) < ABS(fVar128 * fVar155));
        auVar19._4_4_ = fVar148 * fVar149 - fVar136 * fVar95;
        auVar19._0_4_ = fVar143 * fVar144 - fVar132 * fVar87;
        auVar19._8_4_ = fVar151 * fVar152 - fVar138 * fVar97;
        auVar19._12_4_ = fVar154 * fVar155 - fVar140 * fVar99;
        local_8b8 = blendvps(auVar133,auVar19,auVar51);
        fVar94 = fVar12 * local_8d8._0_4_ + fVar10 * local_8c8._0_4_ + fVar11 * local_8b8._0_4_;
        fVar62 = fVar12 * local_8d8._4_4_ + fVar10 * local_8c8._4_4_ + fVar11 * local_8b8._4_4_;
        fVar98 = fVar12 * local_8d8._8_4_ + fVar10 * local_8c8._8_4_ + fVar11 * local_8b8._8_4_;
        fVar63 = fVar12 * local_8d8._12_4_ + fVar10 * local_8c8._12_4_ + fVar11 * local_8b8._12_4_;
        auVar104._0_4_ = fVar94 + fVar94;
        auVar104._4_4_ = fVar62 + fVar62;
        auVar104._8_4_ = fVar98 + fVar98;
        auVar104._12_4_ = fVar63 + fVar63;
        auVar71._0_4_ = fVar162 * local_8c8._0_4_ + fVar174 * local_8b8._0_4_;
        auVar71._4_4_ = fVar164 * local_8c8._4_4_ + fVar176 * local_8b8._4_4_;
        auVar71._8_4_ = fVar166 * local_8c8._8_4_ + fVar178 * local_8b8._8_4_;
        auVar71._12_4_ = fVar168 * local_8c8._12_4_ + fVar180 * local_8b8._12_4_;
        fVar135 = fVar64 * local_8d8._0_4_ + auVar71._0_4_;
        fVar120 = fVar83 * local_8d8._4_4_ + auVar71._4_4_;
        fVar139 = fVar84 * local_8d8._8_4_ + auVar71._8_4_;
        fVar121 = fVar85 * local_8d8._12_4_ + auVar71._12_4_;
        auVar67 = rcpps(auVar71,auVar104);
        fVar94 = auVar67._0_4_;
        fVar62 = auVar67._4_4_;
        fVar98 = auVar67._8_4_;
        fVar63 = auVar67._12_4_;
        local_8e8._0_4_ = ((1.0 - auVar104._0_4_ * fVar94) * fVar94 + fVar94) * (fVar135 + fVar135);
        local_8e8._4_4_ = ((1.0 - auVar104._4_4_ * fVar62) * fVar62 + fVar62) * (fVar120 + fVar120);
        local_8e8._8_4_ = ((1.0 - auVar104._8_4_ * fVar98) * fVar98 + fVar98) * (fVar139 + fVar139);
        local_8e8._12_4_ =
             ((1.0 - auVar104._12_4_ * fVar63) * fVar63 + fVar63) * (fVar121 + fVar121);
        fVar94 = *(float *)(ray + k * 4 + 0x80);
        fVar62 = *(float *)(ray + k * 4 + 0x30);
        auVar72._0_4_ =
             -(uint)(local_8e8._0_4_ <= fVar94 && fVar62 <= local_8e8._0_4_) & auVar158._0_4_;
        auVar72._4_4_ =
             -(uint)(local_8e8._4_4_ <= fVar94 && fVar62 <= local_8e8._4_4_) & auVar158._4_4_;
        auVar72._8_4_ =
             -(uint)(local_8e8._8_4_ <= fVar94 && fVar62 <= local_8e8._8_4_) & auVar158._8_4_;
        auVar72._12_4_ =
             -(uint)(local_8e8._12_4_ <= fVar94 && fVar62 <= local_8e8._12_4_) & auVar158._12_4_;
        iVar35 = movmskps(iVar35,auVar72);
        if (iVar35 == 0) goto LAB_002a720c;
        auVar73._0_4_ = auVar72._0_4_ & -(uint)(auVar104._0_4_ != 0.0);
        auVar73._4_4_ = auVar72._4_4_ & -(uint)(auVar104._4_4_ != 0.0);
        auVar73._8_4_ = auVar72._8_4_ & -(uint)(auVar104._8_4_ != 0.0);
        auVar73._12_4_ = auVar72._12_4_ & -(uint)(auVar104._12_4_ != 0.0);
        iVar35 = movmskps(iVar35,auVar73);
        if (iVar35 == 0) goto LAB_002a720c;
        pGVar16 = (context->scene->geometries).items[uVar14].ptr;
        if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_002a720c;
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar67 = rcpps(local_8a8,local_8a8);
          fVar94 = auVar67._0_4_;
          fVar62 = auVar67._4_4_;
          fVar98 = auVar67._8_4_;
          fVar63 = auVar67._12_4_;
          fVar94 = (float)(-(uint)(1e-18 <= ABS(local_8a8._0_4_)) &
                          (uint)(((float)DAT_01feca10 - local_8a8._0_4_ * fVar94) * fVar94 + fVar94)
                          );
          fVar62 = (float)(-(uint)(1e-18 <= ABS(local_8a8._4_4_)) &
                          (uint)((DAT_01feca10._4_4_ - local_8a8._4_4_ * fVar62) * fVar62 + fVar62))
          ;
          fVar98 = (float)(-(uint)(1e-18 <= ABS(local_8a8._8_4_)) &
                          (uint)((DAT_01feca10._8_4_ - local_8a8._8_4_ * fVar98) * fVar98 + fVar98))
          ;
          fVar63 = (float)(-(uint)(1e-18 <= ABS(local_8a8._12_4_)) &
                          (uint)((DAT_01feca10._12_4_ - local_8a8._12_4_ * fVar63) * fVar63 + fVar63
                                ));
          auVar74._0_4_ = fVar157 * fVar94;
          auVar74._4_4_ = fVar160 * fVar62;
          auVar74._8_4_ = local_898._8_4_ * fVar98;
          auVar74._12_4_ = local_898._12_4_ * fVar63;
          auVar75 = minps(auVar74,_DAT_01feca10);
          auVar52._0_4_ = fVar94 * fVar163;
          auVar52._4_4_ = fVar62 * fVar165;
          auVar52._8_4_ = fVar98 * fVar167;
          auVar52._12_4_ = fVar63 * fVar169;
          auVar69 = minps(auVar52,_DAT_01feca10);
          auVar67 = *(undefined1 (*) [16])local_9c0;
          auVar113 = auVar67._0_12_;
          auVar46 = *(undefined1 (*) [16])(local_9c0 + uVar30 * 4);
          auVar102 = auVar46._0_12_;
          if (uVar30 == 2) {
            auVar113._0_8_ = auVar67._0_8_;
            auVar113._8_4_ = auVar67._4_4_;
            auVar102._0_8_ = auVar46._0_8_;
            auVar102._8_4_ = auVar46._4_4_;
          }
          auVar116._4_4_ = auVar113._4_4_;
          auVar116._8_4_ = auVar113._8_4_;
          auVar91._0_8_ = auVar113._0_8_;
          auVar91._8_4_ = auVar116._4_4_;
          uVar109 = auVar102._4_4_;
          auVar91._12_4_ = uVar109;
          auVar90._8_8_ = auVar91._8_8_;
          auVar90._0_4_ = auVar113._0_4_;
          uVar101 = auVar102._0_4_;
          auVar90._4_4_ = uVar101;
          auVar116._0_4_ = auVar116._4_4_;
          auVar116._12_4_ = auVar116._8_4_;
          auVar105._0_8_ = auVar102._0_8_;
          auVar105._8_4_ = uVar109;
          auVar105._12_4_ = auVar102._8_4_;
          pblendw(auVar90,ZEXT816(0),0xaa);
          pblendw(auVar116,ZEXT816(0),0xaa);
          pblendw(auVar105,ZEXT816(0),0xaa);
          local_8f8[1] = ((1.0 - auVar75._4_4_) - auVar69._4_4_) *
                         (float)(uVar101 >> 0x10) * 0.00012207031 +
                         (float)(uVar109 >> 0x10) * 0.00012207031 * auVar69._4_4_ +
                         (float)(auVar116._4_4_ >> 0x10) * 0.00012207031 * auVar75._4_4_;
          local_8f8[0] = ((1.0 - auVar75._0_4_) - auVar69._0_4_) *
                         (float)(auVar90._0_4_ >> 0x10) * 0.00012207031 +
                         (float)(uVar101 >> 0x10) * 0.00012207031 * auVar69._0_4_ +
                         (float)(auVar116._4_4_ >> 0x10) * 0.00012207031 * auVar75._0_4_;
          local_8f8[2] = ((1.0 - auVar75._8_4_) - auVar69._8_4_) *
                         (float)(auVar116._4_4_ >> 0x10) * 0.00012207031 +
                         (float)(uVar109 >> 0x10) * 0.00012207031 * auVar69._8_4_ +
                         (float)(auVar116._8_4_ >> 0x10) * 0.00012207031 * auVar75._8_4_;
          local_8f8[3] = ((1.0 - auVar75._12_4_) - auVar69._12_4_) *
                         (float)(uVar109 >> 0x10) * 0.00012207031 +
                         (float)(auVar102._8_4_ >> 0x10) * 0.00012207031 * auVar69._12_4_ +
                         (float)(auVar116._8_4_ >> 0x10) * 0.00012207031 * auVar75._12_4_;
          iVar35 = movmskps((int)pGVar16,auVar73);
          local_b18 = CONCAT44((int)((ulong)pGVar16 >> 0x20),iVar35);
          uVar31 = 0;
          if (local_b18 != 0) {
            for (; (local_b18 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          bVar44 = iVar35 == 0;
          if (!bVar44) {
            local_a68 = CONCAT44(uVar39,uVar39);
            local_9a8 = (float)*(undefined8 *)*local_990;
            fStack_9a4 = (float)((ulong)*(undefined8 *)*local_990 >> 0x20);
            fStack_9a0 = (float)*(undefined8 *)(*local_990 + 8);
            fStack_99c = (float)((ulong)*(undefined8 *)(*local_990 + 8) >> 0x20);
            local_9b8 = uVar30;
            local_9b0 = (ulong)uVar34;
            local_998 = uVar30;
            do {
              uVar13 = *(undefined4 *)(ray + k * 4 + 0x80);
              local_838 = local_8f8[uVar31 - 4];
              fVar94 = local_8f8[uVar31];
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8e8 + uVar31 * 4);
              args.context = context->user;
              local_828._4_4_ = fVar94;
              local_828._0_4_ = fVar94;
              local_828._8_4_ = fVar94;
              local_828._12_4_ = fVar94;
              local_868 = *(undefined4 *)(local_8d8 + uVar31 * 4);
              local_858 = *(undefined4 *)(local_8c8 + uVar31 * 4);
              local_848 = *(undefined4 *)(local_8b8 + uVar31 * 4);
              uStack_864 = local_868;
              uStack_860 = local_868;
              uStack_85c = local_868;
              uStack_854 = local_858;
              uStack_850 = local_858;
              uStack_84c = local_858;
              uStack_844 = local_848;
              uStack_840 = local_848;
              uStack_83c = local_848;
              fStack_834 = local_838;
              fStack_830 = local_838;
              fStack_82c = local_838;
              local_818 = local_a68;
              uStack_810 = CONCAT44(uVar39,uVar39);
              local_808 = CONCAT44(uVar14,uVar14);
              uStack_800 = CONCAT44(uVar14,uVar14);
              local_7f8 = (args.context)->instID[0];
              uStack_7f4 = local_7f8;
              uStack_7f0 = local_7f8;
              uStack_7ec = local_7f8;
              local_7e8 = (args.context)->instPrimID[0];
              uStack_7e4 = local_7e8;
              uStack_7e0 = local_7e8;
              uStack_7dc = local_7e8;
              local_9e8._4_4_ = fStack_9a4;
              local_9e8._0_4_ = local_9a8;
              local_9e8._8_4_ = fStack_9a0;
              local_9e8._12_4_ = fStack_99c;
              args.valid = (int *)local_9e8;
              args.geometryUserPtr = pGVar16->userPtr;
              args.hit = (RTCHitN *)&local_868;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar16->occlusionFilterN)(&args);
                uVar30 = local_998;
              }
              if (local_9e8 == (undefined1  [16])0x0) {
                auVar76._8_4_ = 0xffffffff;
                auVar76._0_8_ = 0xffffffffffffffff;
                auVar76._12_4_ = 0xffffffff;
                auVar76 = auVar76 ^ _DAT_01febe20;
              }
              else {
                p_Var17 = context->args->filter;
                if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var17)(&args);
                  uVar30 = local_998;
                }
                auVar53._0_4_ = -(uint)(local_9e8._0_4_ == 0);
                auVar53._4_4_ = -(uint)(local_9e8._4_4_ == 0);
                auVar53._8_4_ = -(uint)(local_9e8._8_4_ == 0);
                auVar53._12_4_ = -(uint)(local_9e8._12_4_ == 0);
                auVar76 = auVar53 ^ _DAT_01febe20;
                auVar67 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar53);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar67;
              }
              if ((_DAT_01fecb20 & auVar76) != (undefined1  [16])0x0) {
                if (!bVar44) {
                  bVar44 = true;
                  sVar37 = 0;
                  goto LAB_002a77fc;
                }
                break;
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar13;
              local_b18 = local_b18 ^ 1L << (uVar31 & 0x3f);
              uVar31 = 0;
              if (local_b18 != 0) {
                for (; (local_b18 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              bVar44 = local_b18 == 0;
            } while (!bVar44);
          }
          goto LAB_002a720c;
        }
LAB_002a779a:
        bVar44 = true;
        sVar37 = 0;
      }
      else {
        pGVar33 = (GridSOA *)(uVar31 & 0xfffffffffffffff0);
        sVar37 = *(size_t *)(pGVar33 + (ulong)*(uint *)(pGVar33 + 0x2c) + 0x30);
        (local_9d0->super_Precalculations).grid = pGVar33;
LAB_002a7892:
        bVar44 = false;
      }
LAB_002a77fc:
      if (bVar44) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar34 = 1;
      }
      else {
        uVar34 = 0;
        if (sVar37 != 0) {
          local_b48->ptr = sVar37;
          local_b48 = local_b48 + 1;
        }
      }
    }
    pNVar29 = local_b48;
  } while ((uVar34 & 3) == 0);
  return local_878 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }